

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushID(char *str_id_begin,char *str_id_end)

{
  ImVector<unsigned_int> *this;
  ImGuiID local_24;
  ImGuiWindow *local_20;
  ImGuiWindow *window;
  char *str_id_end_local;
  char *str_id_begin_local;
  
  window = (ImGuiWindow *)str_id_end;
  str_id_end_local = str_id_begin;
  local_20 = GetCurrentWindowRead();
  this = &local_20->IDStack;
  local_24 = ImGuiWindow::GetID(local_20,str_id_end_local,(char *)window);
  ImVector<unsigned_int>::push_back(this,&local_24);
  return;
}

Assistant:

void ImGui::PushID(const char* str_id_begin, const char* str_id_end)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    window->IDStack.push_back(window->GetID(str_id_begin, str_id_end));
}